

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O0

void absl::lts_20240722::internal_any_invocable::
     LocalInvoker<false,void,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__0&,google::protobuf::io::Printer*>
               (TypeErasedState *state,ForwardedParameterType<google::protobuf::io::Printer_*> args)

{
  anon_class_16_2_4df4e3d3 *local_28;
  anon_class_16_2_4df4e3d3 *local_20;
  anon_class_16_2_4df4e3d3 *f;
  ForwardedParameterType<google::protobuf::io::Printer_*> args_local;
  TypeErasedState *state_local;
  
  f = (anon_class_16_2_4df4e3d3 *)args;
  args_local = (ForwardedParameterType<google::protobuf::io::Printer_*>)state;
  local_20 = ObjectInLocalStorage<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__0>
                       (state);
  local_28 = f;
  InvokeR<void,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__0&,google::protobuf::io::Printer*,void>
            (local_20,(Printer **)&local_28);
  return;
}

Assistant:

ReturnType LocalInvoker(
    TypeErasedState* const state,
    ForwardedParameterType<P>... args) noexcept(SigIsNoexcept) {
  using RawT = RemoveCVRef<QualTRef>;
  static_assert(
      IsStoredLocally<RawT>::value,
      "Target object must be in local storage in order to be invoked from it.");

  auto& f = (ObjectInLocalStorage<RawT>)(state);
  return (InvokeR<ReturnType>)(static_cast<QualTRef>(f),
                               static_cast<ForwardedParameterType<P>>(args)...);
}